

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock.h
# Opt level: O0

void __thiscall
testing::Matcher<fmt::v5::basic_string_view<char>_>::Matcher
          (Matcher<fmt::v5::basic_string_view<char>_> *this,basic_string_view<char> value)

{
  basic_string_view<char> x;
  EqMatcher<fmt::v5::basic_string_view<char>_> *in_RSI;
  Matcher<fmt::v5::basic_string_view<char>_> *in_RDI;
  Matcher<fmt::v5::basic_string_view<char>_> *in_stack_ffffffffffffff78;
  
  internal::MatcherBase<fmt::v5::basic_string_view<char>_>::MatcherBase
            ((MatcherBase<fmt::v5::basic_string_view<char>_> *)0x127e58);
  (in_RDI->super_MatcherBase<fmt::v5::basic_string_view<char>_>)._vptr_MatcherBase =
       (_func_int **)&PTR__Matcher_002691c0;
  x.size_ = (size_t)in_RDI;
  x.data_ = (char *)in_stack_ffffffffffffff78;
  Eq<fmt::v5::basic_string_view<char>>(x);
  internal::EqMatcher::operator_cast_to_Matcher(in_RSI);
  operator=(in_RDI,in_stack_ffffffffffffff78);
  ~Matcher((Matcher<fmt::v5::basic_string_view<char>_> *)0x127ecc);
  return;
}

Assistant:

Matcher<T>::Matcher(T value) { *this = Eq(value); }